

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(uint lhs,
         SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  char cVar2;
  char in_SIL;
  uint in_EDI;
  uint unaff_retaddr;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  unaff_retaddr_00;
  uint ret;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  undefined1 in_stack_fffffffffffffff4;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar4;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff7;
  undefined2 in_stack_fffffffffffffffc;
  char in_stack_ffffffffffffffff;
  
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff7);
  SVar4.m_int = in_SIL;
  bVar1 = DivisionCornerCaseHelper<char,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::DivisionCornerCase1
                    (unaff_retaddr,unaff_retaddr_00,
                     (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT17(in_stack_ffffffffffffffff,
                                 CONCAT16(in_SIL,CONCAT24(in_stack_fffffffffffffffc,in_EDI))));
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<char,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
              ::DivisionCornerCase2
                        (in_EDI,SVar4,
                         (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)&stack0xfffffffffffffff7), !bVar1)) {
    uVar3 = 0;
    cVar2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)((ulong)CONCAT13(in_stack_fffffffffffffff7.m_int,
                                           CONCAT12(in_SIL,CONCAT11(SVar4.m_int,
                                                                    in_stack_fffffffffffffff4))) <<
                          0x20));
    DivisionHelper<unsigned_int,char,1>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((uint *)CONCAT17(in_stack_fffffffffffffff7.m_int,
                                CONCAT16(in_SIL,CONCAT15(SVar4.m_int,
                                                         CONCAT14(in_stack_fffffffffffffff4,uVar3)))
                               ),(char *)CONCAT17(cVar2,in_stack_ffffffffffffffe8),(uint *)0x118569)
    ;
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<unsigned_int>
              ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT17(in_stack_fffffffffffffff7.m_int,
                           CONCAT16(in_SIL,CONCAT15(SVar4.m_int,
                                                    CONCAT14(in_stack_fffffffffffffff4,uVar3)))),
               (uint *)CONCAT17(cVar2,in_stack_ffffffffffffffe8));
    in_stack_fffffffffffffff7.m_int = in_stack_ffffffffffffffff;
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         in_stack_fffffffffffffff7.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}